

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void __thiscall
kratos::InlineGeneratorVisitor::RenameLinkedVar::visit(RenameLinkedVar *this,SwitchStmt *stmt)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Var *pVVar1;
  __shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  pVVar1 = (stmt->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (stmt->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  pVVar1 = match(this,pVVar1);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (pVVar1 != (Var *)0x0) {
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              (local_30,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                        &pVVar1->super_enable_shared_from_this<kratos::Var>);
    SwitchStmt::set_target(stmt,(shared_ptr<kratos::Var> *)local_30);
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
  return;
}

Assistant:

void visit(SwitchStmt* stmt) override {
            if (auto* v = match(stmt->target().get())) {
                stmt->set_target(v->shared_from_this());
            }
        }